

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::UpdatedBlockTip
          (PeerManagerImpl *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  Mutex *pszName;
  Mutex *pszFile;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  uint256 *hash;
  reverse_view<std::ranges::ref_view<std::vector<uint256,_std::allocator<uint256>_>_>_> *__range2;
  Peer *peer;
  pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_> *it;
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *__range1;
  CBlockIndex *pindexToAnnounce;
  reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
  __end2;
  reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
  __begin2;
  iterator __end1;
  iterator __begin1;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock45;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock44;
  CBlockIndex *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  PeerManagerImpl *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  seconds in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar4;
  long local_c8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(undefined4 *)(in_RSI + 0x18);
  CBlockIndex::GetBlockTime(in_stack_fffffffffffffeb8);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffeb8,(long *)0x297fa5);
  SetBestBlock(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffed8);
  if ((in_CL & 1) == 0) {
    std::vector<uint256,_std::allocator<uint256>_>::vector
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffeb8);
    local_c8 = in_RSI;
    do {
      if (local_c8 == in_RDX) break;
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffec8);
      std::vector<uint256,_std::allocator<uint256>_>::push_back
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffeb8,
                 (value_type *)0x298025);
      local_c8 = *(long *)(local_c8 + 8);
      sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffeb8);
    } while (sVar3 != 8);
    pszName = MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffeb8);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)CONCAT44(uVar4,in_stack_fffffffffffffef8),
               in_RDI,(char *)pszName,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8.__r >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffed8.__r >> 0x18,0));
    std::
    map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
    ::begin((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    std::
    map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
    ::end((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffec8,
                                   (_Self *)CONCAT44(in_stack_fffffffffffffec4,
                                                     in_stack_fffffffffffffec0)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
                   *)in_stack_fffffffffffffeb8);
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffec8);
      pszFile = MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffeb8);
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(uVar4,in_stack_fffffffffffffef8),in_RDI,(char *)pszName,(char *)pszFile,
                 (int)((ulong)in_stack_fffffffffffffed8.__r >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffed8.__r >> 0x18,0));
      in_stack_fffffffffffffed8.__r =
           (rep)std::ranges::views::__adaptor::
                operator|<const_std::ranges::views::_Reverse_&,_std::vector<uint256,_std::allocator<uint256>_>_&>
                          ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffec8,
                           (_Reverse *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                          );
      std::ranges::
      reverse_view<std::ranges::ref_view<std::vector<uint256,_std::allocator<uint256>_>_>_>::begin
                ((reverse_view<std::ranges::ref_view<std::vector<uint256,_std::allocator<uint256>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      std::ranges::
      reverse_view<std::ranges::ref_view<std::vector<uint256,_std::allocator<uint256>_>_>_>::end
                ((reverse_view<std::ranges::ref_view<std::vector<uint256,_std::allocator<uint256>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      while (in_stack_fffffffffffffed7 =
                  std::
                  operator==<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                            ((reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                              *)in_stack_fffffffffffffec8,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)),
            ((in_stack_fffffffffffffed7 ^ 0xff) & 1) != 0) {
        in_stack_fffffffffffffec8 =
             (PeerManagerImpl *)
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        std::vector<uint256,_std::allocator<uint256>_>::push_back
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffec8,
                   (value_type *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>_>
                      *)in_stack_fffffffffffffeb8);
      }
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffeb8);
      std::_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
                    *)in_stack_fffffffffffffeb8);
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffeb8);
    CConnman::WakeMessageHandler((CConnman *)in_stack_fffffffffffffec8);
    std::vector<uint256,_std::allocator<uint256>_>::~vector
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffec8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload)
{
    SetBestBlock(pindexNew->nHeight, std::chrono::seconds{pindexNew->GetBlockTime()});

    // Don't relay inventory during initial block download.
    if (fInitialDownload) return;

    // Find the hashes of all blocks that weren't previously in the best chain.
    std::vector<uint256> vHashes;
    const CBlockIndex *pindexToAnnounce = pindexNew;
    while (pindexToAnnounce != pindexFork) {
        vHashes.push_back(pindexToAnnounce->GetBlockHash());
        pindexToAnnounce = pindexToAnnounce->pprev;
        if (vHashes.size() == MAX_BLOCKS_TO_ANNOUNCE) {
            // Limit announcements in case of a huge reorganization.
            // Rely on the peer's synchronization mechanism in that case.
            break;
        }
    }

    {
        LOCK(m_peer_mutex);
        for (auto& it : m_peer_map) {
            Peer& peer = *it.second;
            LOCK(peer.m_block_inv_mutex);
            for (const uint256& hash : vHashes | std::views::reverse) {
                peer.m_blocks_for_headers_relay.push_back(hash);
            }
        }
    }

    m_connman.WakeMessageHandler();
}